

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

void d_soundfile_setup(void)

{
  soundfile_type_setup();
  soundfiler_setup();
  readsf_setup();
  writesf_setup();
  return;
}

Assistant:

void d_soundfile_setup(void)
{
    soundfile_type_setup();
    soundfiler_setup();
    readsf_setup();
    writesf_setup();
}